

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptStackWalker::WalkToArgumentsFrame(JavascriptStackWalker *this,ArgumentsObject *args)

{
  bool bVar1;
  BOOL BVar2;
  ArgumentsObject *pAVar3;
  Var currArgs;
  ArgumentsObject *args_local;
  JavascriptStackWalker *this_local;
  
  do {
    BVar2 = Walk(this,true);
    if (BVar2 == 0) {
      return 0;
    }
    bVar1 = IsJavascriptFrame(this);
  } while ((!bVar1) || (pAVar3 = (ArgumentsObject *)GetCurrentArgumentsObject(this), pAVar3 != args)
          );
  return 1;
}

Assistant:

BOOL JavascriptStackWalker::WalkToArgumentsFrame(ArgumentsObject *args)
    {
        // Move the walker up the stack until we find the given arguments object on the frame.
        while (this->Walk(/*includeInlineFrame*/ true))
        {
            if (this->IsJavascriptFrame())
            {
                Var currArgs = this->GetCurrentArgumentsObject();
                if (currArgs == args)
                {
                    return TRUE;
                }
            }
        }
        return FALSE;
    }